

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Endpoints.cpp
# Opt level: O2

void __thiscall
helics::Endpoint::Endpoint(Endpoint *this,MessageFederate *mFed,string_view name,string_view type)

{
  Endpoint *pEVar1;
  
  pEVar1 = helics::MessageFederate::registerEndpoint(mFed,name,type);
  Endpoint(this,pEVar1);
  return;
}

Assistant:

Endpoint::Endpoint(MessageFederate* mFed, std::string_view name, std::string_view type):
    Endpoint(mFed->registerEndpoint(name, type))
{
}